

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# itm-solver-inequalities-Z.cpp
# Opt level: O2

int __thiscall
baryonyx::itm::
solver_inequalities_Zcoeff<float,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<float>,_false>
::select_variables_101
          (solver_inequalities_Zcoeff<float,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<float>,_false>
           *this,int r_size,int bkmin,int bkmax)

{
  ulong uVar1;
  ulong uVar2;
  ulong uVar3;
  int *piVar4;
  int iVar5;
  ulong uVar6;
  
  piVar4 = &((this->R)._M_t.
             super___uniq_ptr_impl<baryonyx::itm::solver_inequalities_Zcoeff<float,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<float>,_false>::rc_data,_std::default_delete<baryonyx::itm::solver_inequalities_Zcoeff<float,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<float>,_false>::rc_data[]>_>
             ._M_t.
             super__Tuple_impl<0UL,_baryonyx::itm::solver_inequalities_Zcoeff<float,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<float>,_false>::rc_data_*,_std::default_delete<baryonyx::itm::solver_inequalities_Zcoeff<float,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<float>,_false>::rc_data[]>_>
             .
             super__Head_base<0UL,_baryonyx::itm::solver_inequalities_Zcoeff<float,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<float>,_false>::rc_data_*,_false>
            ._M_head_impl)->f;
  uVar3 = 0xfffffffffffffffe;
  iVar5 = 0;
  uVar6 = 0xffffffffffffffff;
  while( true ) {
    if ((long)r_size <= (long)uVar6) {
      return (int)uVar3;
    }
    uVar1 = uVar6;
    if (bkmax < iVar5) {
      uVar1 = uVar3;
    }
    uVar2 = uVar3;
    if (bkmin <= iVar5) {
      uVar2 = uVar1;
    }
    uVar3 = uVar2 & 0xffffffff;
    if (((int)uVar2 != -2) && (0.0 < ((rc_data *)(piVar4 + -2))->value)) break;
    iVar5 = iVar5 + *piVar4;
    uVar6 = uVar6 + 1;
    piVar4 = piVar4 + 3;
  }
  return (int)uVar2;
}

Assistant:

int select_variables_101(const int r_size, int bkmin, int bkmax)
    {
        int sum = 0;
        int best = -2;

        for (int i = -1; i < r_size; ++i) {
            if (bkmin <= sum && sum <= bkmax)
                best = i;

            if (best != -2 && i - 1 < r_size &&
                stop_iterating<Mode>(R[i + 1].value))
                break;

            sum += R[i + 1].f;
        }

        return best;
    }